

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O3

string * __thiscall
wallet::GetAlgorithmName_abi_cxx11_
          (string *__return_storage_ptr__,wallet *this,SelectionAlgorithm algo)

{
  long lVar1;
  undefined7 in_register_00000011;
  char *pcVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  switch((ulong)this & 0xffffffff) {
  case 0:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
LAB_0057cc22:
      __stack_chk_fail(__return_storage_ptr__,this,CONCAT71(in_register_00000011,algo));
    }
    pcVar3 = "bnb";
    pcVar2 = "";
    break;
  case 1:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_0057cc22;
    pcVar3 = "knapsack";
    pcVar2 = "";
    break;
  case 2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_0057cc22;
    pcVar3 = "srd";
    pcVar2 = "";
    break;
  case 3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_0057cc22;
    pcVar3 = "cg";
    pcVar2 = "";
    break;
  case 4:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_0057cc22;
    pcVar3 = "manual";
    pcVar2 = "";
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/coinselection.cpp"
                  ,0x3cd,"std::string wallet::GetAlgorithmName(const SelectionAlgorithm)");
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string GetAlgorithmName(const SelectionAlgorithm algo)
{
    switch (algo)
    {
    case SelectionAlgorithm::BNB: return "bnb";
    case SelectionAlgorithm::KNAPSACK: return "knapsack";
    case SelectionAlgorithm::SRD: return "srd";
    case SelectionAlgorithm::CG: return "cg";
    case SelectionAlgorithm::MANUAL: return "manual";
    // No default case to allow for compiler to warn
    }
    assert(false);
}